

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O1

Am_Object get_objgen_window(void)

{
  Am_Slot_Key key;
  Am_Object_Data *in_RDI;
  Am_Object AStack_18;
  
  am_get_db_from_list((Am_Object *)in_RDI,(Am_Value_List *)&am_objgen,(int *)&objgen_windows);
  key = (Am_Slot_Key)in_RDI;
  Am_Object::Get_Object(&AStack_18,key,(ulong)Am_CONSTANT_OBJECTS_WIDGET);
  Am_Object::Set(&AStack_18,0x169,"",0);
  Am_Object::~Am_Object(&AStack_18);
  Am_Object::Get_Object(&AStack_18,key,(ulong)Am_INDEXES_OF_COMMANDS_WIDGET);
  Am_Object::Set(&AStack_18,0x169,"",0);
  Am_Object::~Am_Object(&AStack_18);
  Am_Object::Get_Object(&AStack_18,key,(ulong)Am_SOME_OBJECTS_WIDGET);
  Am_Object::Set(&AStack_18,0x169,"",0);
  Am_Object::~Am_Object(&AStack_18);
  Am_Object::Get_Object(&AStack_18,key,(ulong)Am_ALL_FROM_COMMAND_WIDGET);
  Am_Object::Set(&AStack_18,0x169,"",0);
  Am_Object::~Am_Object(&AStack_18);
  return (Am_Object)in_RDI;
}

Assistant:

Am_Object
get_objgen_window()
{
  Am_Object w =
      am_get_db_from_list(am_objgen, objgen_windows, num_vis_objgen_windows);
  w.Get_Object(Am_CONSTANT_OBJECTS_WIDGET).Set(Am_VALUE, "");
  w.Get_Object(Am_INDEXES_OF_COMMANDS_WIDGET).Set(Am_VALUE, "");
  w.Get_Object(Am_SOME_OBJECTS_WIDGET).Set(Am_VALUE, "");
  w.Get_Object(Am_ALL_FROM_COMMAND_WIDGET).Set(Am_VALUE, "");

  return w;
}